

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::ArchiveShellCommand::executeExternalCommand
          (ArchiveShellCommand *this,BuildSystem *param_1,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ProcessAttributes attributes;
  ProcessResult __args;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *context_00;
  bool bVar1;
  function<void_(llbuild::basic::ProcessResult)> *this_00;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_180;
  function<void_(llbuild::basic::ProcessResult)> local_158;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_138;
  undefined1 local_110;
  undefined1 uStack_10f;
  undefined6 uStack_10e;
  StringRef local_108;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined6 uStack_f6;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> local_f0;
  allocator<llvm::StringRef> local_d9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_c8;
  ArrayRef<llvm::StringRef> local_b0;
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  uint64_t local_68;
  Twine local_60;
  error_code local_48;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *local_38;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn_local;
  QueueJobContext *context_local;
  BuildSystem *param_2_local;
  ArchiveShellCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (ArchiveShellCommand *)ti.impl;
  local_38 = completionFn;
  completionFn_local = (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)context;
  context_local = (QueueJobContext *)param_1;
  param_2_local = (BuildSystem *)this;
  llvm::Twine::Twine(&local_60,&this->archiveName);
  local_48._M_value = llvm::sys::fs::remove((fs *)&local_60,(char *)0x1);
  bVar1 = std::error_code::operator_cast_to_bool(&local_48);
  if (bVar1) {
    bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                      (completionFn);
    if (bVar1) {
      this_00 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                          (completionFn);
      llbuild::basic::ProcessResult::ProcessResult
                ((ProcessResult *)
                 &args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,Failed,-1,-1,0,0,0);
      __args._8_8_ = uStack_80;
      __args._0_8_ = args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __args.utime = local_78;
      __args.stime = uStack_70;
      __args.maxrss = local_68;
      std::function<void_(llbuild::basic::ProcessResult)>::operator()(this_00,__args);
    }
  }
  else {
    (anonymous_namespace)::ArchiveShellCommand::getArgs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0,this);
    context_00 = completionFn_local;
    local_d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a0);
    local_d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0);
    std::allocator<llvm::StringRef>::allocator(&local_d9);
    std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
    vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_c8,local_d0,
               local_d8,&local_d9);
    llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>(&local_b0,&local_c8);
    memset(&local_f0,0,0x10);
    llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::ArrayRef(&local_f0);
    local_110 = 1;
    uStack_10f = 0;
    memset(&local_108,0,0x10);
    llvm::StringRef::StringRef(&local_108);
    local_f8 = 1;
    uStack_f7 = 1;
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
              (&local_180,completionFn);
    std::function<void(llbuild::basic::ProcessResult)>::
    function<(anonymous_namespace)::ArchiveShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::_lambda(llbuild::basic::ProcessResult)_1_,void>
              ((function<void(llbuild::basic::ProcessResult)> *)&local_158,
               (anon_class_40_1_0860c3c2 *)&local_180);
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
              (&local_138,&local_158);
    attributes.connectToConsole = (bool)uStack_10f;
    attributes.canSafelyInterrupt = (bool)local_110;
    attributes._2_6_ = uStack_10e;
    attributes.controlEnabled = (bool)uStack_f7;
    attributes.inheritEnvironment = (bool)local_f8;
    attributes._26_6_ = uStack_f6;
    attributes.workingDir.Data = local_108.Data;
    attributes.workingDir.Length = local_108.Length;
    llbuild::core::TaskInterface::spawn
              ((TaskInterface *)&this_local,(QueueJobContext *)context_00,local_b0,local_f0,
               attributes,&local_138,(ProcessDelegate *)0x0);
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::~Optional(&local_138);
    std::function<void_(llbuild::basic::ProcessResult)>::~function(&local_158);
    (anonymous_namespace)::ArchiveShellCommand::
    executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)
    ::{lambda(llbuild::basic::ProcessResult)#1}::~Optional
              ((_lambda_llbuild__basic__ProcessResult__1_ *)&local_180);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_c8);
    std::allocator<llvm::StringRef>::~allocator(&local_d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem&,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    // First delete the current archive
    // TODO instead insert, update and remove files from the archive
    if (llvm::sys::fs::remove(archiveName, /*IgnoreNonExisting*/ true)) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Create archive
    auto args = getArgs();
    ti.spawn(context,
             std::vector<StringRef>(args.begin(), args.end()),
             {}, {true},
             {[completionFn](ProcessResult result) {
      if (completionFn.hasValue())
        completionFn.getValue()(result);
    }});
  }